

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

void __thiscall duckdb::QueryProfiler::StartPhase(QueryProfiler *this,MetricsType phase_metric)

{
  value_type local_11;
  
  ::std::mutex::lock(&this->lock);
  if (((this->is_explain_analyze != false) || ((this->context->config).enable_profiler == true)) &&
     (this->running == true)) {
    ::std::vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>::push_back
              (&(this->phase_stack).
                super_vector<duckdb::MetricsType,_std::allocator<duckdb::MetricsType>_>,&local_11);
    BaseProfiler<std::chrono::_V2::steady_clock>::Start(&this->phase_profiler);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void QueryProfiler::StartPhase(MetricsType phase_metric) {
	lock_guard<std::mutex> guard(lock);
	if (!IsEnabled() || !running) {
		return;
	}

	// start a new phase
	phase_stack.push_back(phase_metric);
	// restart the timer
	phase_profiler.Start();
}